

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

Image<float,_gimage::PixelTraits<float>_> * __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::operator=
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  int iVar1;
  long lVar2;
  float *pfVar3;
  float **ppfVar4;
  float ***pppfVar5;
  
  iVar1 = this->depth;
  this->depth = a->depth;
  a->depth = iVar1;
  lVar2 = this->width;
  this->width = a->width;
  a->width = lVar2;
  lVar2 = this->height;
  this->height = a->height;
  a->height = lVar2;
  lVar2 = this->n;
  this->n = a->n;
  a->n = lVar2;
  pfVar3 = this->pixel;
  this->pixel = a->pixel;
  a->pixel = pfVar3;
  ppfVar4 = this->row;
  this->row = a->row;
  a->row = ppfVar4;
  pppfVar5 = this->img;
  this->img = a->img;
  a->img = pppfVar5;
  return this;
}

Assistant:

Image<T> &operator=(Image<T> &&a) noexcept
    {
      std::swap(depth, a.depth);
      std::swap(width, a.width);
      std::swap(height, a.height);
      std::swap(n, a.n);
      std::swap(pixel, a.pixel);
      std::swap(row, a.row);
      std::swap(img, a.img);

      return *this;
    }